

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime_test.cpp
# Opt level: O1

XrResult RuntimeTestXrGetInstanceProcAddr
                   (XrInstance instance,char *name,PFN_xrVoidFunction *function)

{
  int iVar1;
  XrResult XVar2;
  code *pcVar3;
  
  iVar1 = strcmp(name,"xrGetInstanceProcAddr");
  if (iVar1 == 0) {
    pcVar3 = RuntimeTestXrGetInstanceProcAddr;
  }
  else {
    iVar1 = strcmp(name,"xrEnumerateInstanceExtensionProperties");
    if (iVar1 == 0) {
      pcVar3 = RuntimeTestXrEnumerateInstanceExtensionProperties;
    }
    else {
      iVar1 = strcmp(name,"xrCreateInstance");
      if (iVar1 != 0) goto LAB_00101251;
      pcVar3 = RuntimeTestXrCreateInstance;
    }
  }
  *function = pcVar3;
LAB_00101251:
  if (instance == (XrInstance)0x0) {
    XVar2 = XR_ERROR_HANDLE_INVALID;
  }
  else {
    iVar1 = strcmp(name,"xrDestroyInstance");
    if (iVar1 == 0) {
      pcVar3 = RuntimeTestXrDestroyInstance;
    }
    else {
      iVar1 = strcmp(name,"xrGetSystem");
      if (iVar1 == 0) {
        pcVar3 = RuntimeTestXrGetSystem;
      }
      else {
        iVar1 = strcmp(name,"xrGetSystemProperties");
        pcVar3 = (PFN_xrVoidFunction)0x0;
        if (iVar1 == 0) {
          pcVar3 = RuntimeTestXrGetSystemProperties;
        }
      }
    }
    *function = pcVar3;
    XVar2 = XR_ERROR_FUNCTION_UNSUPPORTED;
    if (pcVar3 != (PFN_xrVoidFunction)0x0) {
      XVar2 = XR_SUCCESS;
    }
  }
  return XVar2;
}

Assistant:

static XRAPI_ATTR XrResult XRAPI_CALL RuntimeTestXrGetInstanceProcAddr(XrInstance instance, const char *name,
                                                                       PFN_xrVoidFunction *function) {
    if (0 == strcmp(name, "xrGetInstanceProcAddr")) {
        *function = reinterpret_cast<PFN_xrVoidFunction>(RuntimeTestXrGetInstanceProcAddr);
    } else if (0 == strcmp(name, "xrEnumerateInstanceExtensionProperties")) {
        *function = reinterpret_cast<PFN_xrVoidFunction>(RuntimeTestXrEnumerateInstanceExtensionProperties);
    } else if (0 == strcmp(name, "xrCreateInstance")) {
        *function = reinterpret_cast<PFN_xrVoidFunction>(RuntimeTestXrCreateInstance);
    };
    if (instance == XR_NULL_HANDLE) {
        return XR_ERROR_HANDLE_INVALID;
    }
    if (0 == strcmp(name, "xrDestroyInstance")) {
        *function = reinterpret_cast<PFN_xrVoidFunction>(RuntimeTestXrDestroyInstance);
    } else if (0 == strcmp(name, "xrGetSystem")) {
        *function = reinterpret_cast<PFN_xrVoidFunction>(RuntimeTestXrGetSystem);
    } else if (0 == strcmp(name, "xrGetSystemProperties")) {
        *function = reinterpret_cast<PFN_xrVoidFunction>(RuntimeTestXrGetSystemProperties);
    } else {
        *function = nullptr;
    }

    return *function ? XR_SUCCESS : XR_ERROR_FUNCTION_UNSUPPORTED;
}